

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyjson.h
# Opt level: O1

bool tinyjson::json_parser::parse_array(json_node *value,char **token,string *err)

{
  byte bVar1;
  char *pcVar2;
  iterator __position;
  Storage SVar3;
  bool bVar4;
  int iVar5;
  vector<tinyjson::json_node*,std::allocator<tinyjson::json_node*>> *this;
  size_t sVar6;
  json_node *value_00;
  string *psVar7;
  char *pcVar8;
  byte *pbVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  json_node *current_value;
  string str_value;
  json_node *local_80;
  undefined8 local_78;
  undefined5 uStack_70;
  undefined1 uStack_6b;
  undefined2 uStack_6a;
  undefined1 uStack_68;
  undefined5 uStack_67;
  undefined2 uStack_62;
  
  this = (vector<tinyjson::json_node*,std::allocator<tinyjson::json_node*>> *)operator_new(0x18);
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  pcVar2 = *token;
  sVar6 = strspn(pcVar2," \t\n\r");
  pcVar8 = pcVar2 + sVar6;
  *token = pcVar8;
  if (pcVar2[sVar6] != ']') {
    do {
      value_00 = (json_node *)operator_new(0x10);
      (value_00->storage).num_val = 0.0;
      value_00->type = null_type;
      pcVar8 = *token;
      local_80 = value_00;
      sVar6 = strspn(pcVar8," \t\n\r");
      *token = pcVar8 + sVar6;
      if (pcVar8[sVar6] == '{') {
        *token = pcVar8 + sVar6 + 1;
        bVar4 = parse_object(value_00,token,err);
LAB_001035fb:
        if (bVar4 == false) {
          return false;
        }
      }
      else {
        pcVar8 = *token;
        sVar6 = strspn(pcVar8," \t\n\r");
        *token = pcVar8 + sVar6;
        if (pcVar8[sVar6] == '[') {
          *token = pcVar8 + sVar6 + 1;
          bVar4 = parse_array(value_00,token,err);
          goto LAB_001035fb;
        }
        pbVar9 = (byte *)*token;
        bVar1 = *pbVar9;
        if (bVar1 < 0x6e) {
          if (bVar1 == 0x22) {
            local_78._0_5_ = SUB85(&uStack_68,0);
            local_78._5_3_ = (undefined3)((ulong)&uStack_68 >> 0x28);
            uStack_70 = 0;
            uStack_6b = 0;
            uStack_6a = 0;
            uStack_68 = 0;
            if (*pbVar9 == 0x22) {
              *token = (char *)(pbVar9 + 1);
            }
            pcVar8 = *token;
            sVar6 = strcspn(pcVar8,"\"");
            uStack_70 = 0;
            uStack_6b = 0;
            uStack_6a = 0;
            uStack_68 = 0;
            if (sVar6 != 0) {
              std::__cxx11::string::_M_replace((ulong)&local_78,0,(char *)0x0,(ulong)pcVar8);
            }
            *token = pcVar8 + sVar6 + 1;
            value_00->type = string_type;
            psVar7 = (string *)operator_new(0x20);
            *(string **)psVar7 = psVar7 + 0x10;
            std::__cxx11::string::_M_construct<char*>
                      (psVar7,CONCAT35(local_78._5_3_,(undefined5)local_78),
                       CONCAT26(uStack_6a,CONCAT15(uStack_6b,uStack_70)) +
                       CONCAT35(local_78._5_3_,(undefined5)local_78));
            (value_00->storage).array_val = (array *)psVar7;
            if ((undefined1 *)CONCAT35(local_78._5_3_,(undefined5)local_78) != &uStack_68) {
              operator_delete((undefined1 *)CONCAT35(local_78._5_3_,(undefined5)local_78),
                              CONCAT26(uStack_62,CONCAT51(uStack_67,uStack_68)) + 1);
            }
          }
          else {
LAB_00103760:
            if ((bVar1 != 0x66) || (iVar5 = strncmp((char *)pbVar9,"false",5), iVar5 != 0))
            goto LAB_001037a2;
            value_00->type = boolean_type;
            (value_00->storage).bool_val = false;
            pbVar9 = pbVar9 + 5;
LAB_0010389d:
            *token = (char *)pbVar9;
          }
        }
        else {
          if (bVar1 == 0x6e) {
            iVar5 = strncmp((char *)pbVar9,"null",4);
            if (iVar5 == 0) goto LAB_00103899;
          }
          else if (bVar1 == 0x74) {
            iVar5 = strncmp((char *)pbVar9,"true",4);
            if (iVar5 != 0) goto LAB_00103760;
            value_00->type = boolean_type;
            (value_00->storage).bool_val = true;
LAB_00103899:
            pbVar9 = pbVar9 + 4;
            goto LAB_0010389d;
          }
LAB_001037a2:
          sVar6 = strspn((char *)pbVar9," \t");
          pbVar9 = pbVar9 + sVar6;
          *token = (char *)pbVar9;
          sVar6 = strcspn((char *)pbVar9," \t,\n\r}]");
          if (sVar6 == 0) {
            uVar10 = 0;
            uVar11 = 0;
            bVar4 = false;
          }
          else {
            bVar4 = atod((char *)pbVar9,(char *)(pbVar9 + sVar6),(double *)&local_78);
            uVar10 = 0;
            uVar11 = 0;
            if (bVar4) {
              uVar10 = (undefined4)(undefined5)local_78;
              uVar11 = (undefined4)(CONCAT35(local_78._5_3_,(undefined5)local_78) >> 0x20);
              *token = (char *)(pbVar9 + sVar6);
            }
          }
          if (bVar4 == false) {
            uStack_70 = 0x2e726f72;
            local_78._0_5_ = 0x6573726170;
            local_78._5_3_ = 0x726520;
            pcVar8 = (char *)err->_M_string_length;
            strlen((char *)&local_78);
            std::__cxx11::string::_M_replace((ulong)err,0,pcVar8,(ulong)&local_78);
            return false;
          }
          value_00->type = number_type;
          SVar3._4_4_ = uVar11;
          SVar3._0_4_ = uVar10;
          value_00->storage = SVar3;
        }
      }
      __position._M_current = *(json_node ***)(this + 8);
      if (__position._M_current == *(json_node ***)(this + 0x10)) {
        std::vector<tinyjson::json_node*,std::allocator<tinyjson::json_node*>>::
        _M_realloc_insert<tinyjson::json_node*&>(this,__position,&local_80);
      }
      else {
        *__position._M_current = local_80;
        *(long *)(this + 8) = *(long *)(this + 8) + 8;
      }
      pcVar8 = *token;
      sVar6 = strspn(pcVar8," \t\n\r");
      *token = pcVar8 + sVar6;
      if (pcVar8[sVar6] != ',') goto LAB_001038b5;
      *token = pcVar8 + sVar6 + 1;
    } while( true );
  }
LAB_001038d4:
  *token = pcVar8 + 1;
  value->type = array_type;
  (value->storage).array_val = (array *)this;
  return true;
LAB_001038b5:
  pcVar2 = *token;
  sVar6 = strspn(pcVar2," \t\n\r");
  pcVar8 = pcVar2 + sVar6;
  *token = pcVar8;
  if (pcVar2[sVar6] != ']') {
    local_78._0_5_ = 0x6c61766e69;
    local_78._5_3_ = 0x206469;
    uStack_70 = 0x6f20646e65;
    uStack_6b = 0x66;
    uStack_6a = 0x6120;
    uStack_68 = 0x72;
    uStack_67 = 0x2e796172;
    pcVar8 = (char *)err->_M_string_length;
    strlen((char *)&local_78);
    std::__cxx11::string::_M_replace((ulong)err,0,pcVar8,(ulong)&local_78);
    return false;
  }
  goto LAB_001038d4;
}

Assistant:

static bool parse_array(json_node& value, const char** token, std::string& err) {
      array* root = new array();

      // empty array
      if (expect_token(token, token_type::end_array)) {
        value.set(root);
        return true;
      }

      do {
        json_node* current_value = new json_node();
        if (expect_token(token, token_type::start_object)) {
          if (!parse_object(*current_value, token, err)) return false;
        } else if (expect_token(token, token_type::start_array)) {
          if (!parse_array(*current_value, token, err)) return false;
        } else {
          if (!parse_value(*current_value, token, err)) return false;
        }
        root->emplace_back(current_value);
      } while(expect_token(token, token_type::comma));

      if (!expect_token(token, token_type::end_array)) {
        return make_err_msg("invalid end of array.", err);
      }

      value.set(root);
      return true;
    }